

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O3

void __thiscall
gl3cts::ClipDistance::Utility::VertexArrayObject::drawWithTransformFeedback
          (VertexArrayObject *this,GLuint first,GLuint count,bool discard_rasterizer)

{
  GLenum GVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,discard_rasterizer) != 0) {
    (*this->m_gl->enable)(0x8c89);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glEnable call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x65f);
  }
  (*this->m_gl->beginTransformFeedback)(0);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x663);
  (*this->m_gl->drawArrays)(this->m_primitive_type,first,count);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glDrawArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x650);
  (*this->m_gl->endTransformFeedback)();
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                  ,0x668);
  if (discard_rasterizer) {
    (*this->m_gl->disable)(0x8c89);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glDisbale call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x66d);
    return;
  }
  return;
}

Assistant:

void gl3cts::ClipDistance::Utility::VertexArrayObject::drawWithTransformFeedback(glw::GLuint first, glw::GLuint count,
																				 bool discard_rasterizer)
{
	if (discard_rasterizer)
	{
		m_gl.enable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEnable call failed.");
	}

	m_gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBeginTransformFeedback call failed.");

	draw(first, count);

	m_gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEndTransformFeedback call failed.");

	if (discard_rasterizer)
	{
		m_gl.disable(GL_RASTERIZER_DISCARD);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDisbale call failed.");
	}
}